

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::OlsonTimeZone::getTimeZoneRules
          (OlsonTimeZone *this,InitialTimeZoneRule **initial,TimeZoneRule **trsrules,
          int32_t *trscount,UErrorCode *status)

{
  SimpleTimeZone *pSVar1;
  int iVar2;
  ulong uVar3;
  ushort uVar4;
  int32_t iVar5;
  long lVar6;
  int32_t tmpcnt;
  InitialTimeZoneRule *tmpini;
  int local_3c;
  undefined1 local_38 [8];
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  checkTransitionRules(this,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *initial = this->initialRule;
    iVar2 = *trscount;
    if (iVar2 < 1 || this->historicRules == (TimeArrayTimeZoneRule **)0x0) {
      iVar5 = 0;
    }
    else {
      uVar3 = 0;
      uVar4 = (ushort)*(undefined4 *)&this->historicRuleCount;
      if ((short)uVar4 < 1) {
        uVar4 = 0;
      }
      iVar5 = 0;
      for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        if (this->historicRules[uVar3] != (TimeArrayTimeZoneRule *)0x0) {
          lVar6 = (long)iVar5;
          iVar5 = iVar5 + 1;
          trsrules[lVar6] = &this->historicRules[uVar3]->super_TimeZoneRule;
          if (iVar2 <= iVar5) break;
        }
      }
      iVar2 = *trscount;
    }
    pSVar1 = this->finalZoneWithStartYear;
    if ((pSVar1 != (SimpleTimeZone *)0x0) &&
       (local_3c = iVar2 - iVar5, local_3c != 0 && iVar5 <= iVar2)) {
      (*(pSVar1->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0x12])
                (pSVar1,local_38,trsrules + iVar5,&local_3c,status);
      if (U_ZERO_ERROR < *status) {
        return;
      }
      iVar5 = iVar5 + local_3c;
    }
    *trscount = iVar5;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }